

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>::operator()
          (bin_writer<1> *this,
          back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *it)

{
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar1;
  
  bVar1 = internal::
          format_uint<1u,wchar_t,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,unsigned_long>
                    ((back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>)
                     it->container,*(unsigned_long *)this,*(int *)(this + 8),false);
  it->container = (vector<wchar_t,_std::allocator<wchar_t>_> *)bVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }